

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O1

void crnlib::dxt_fast::compress_color_block
               (uint n,color_quad_u8 *block,uint *low16,uint *high16,uint8 *pSelectors,bool refine)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint *puVar6;
  uint8 uVar7;
  uint8 uVar8;
  uint8 uVar9;
  bool bVar10;
  uint16 uVar11;
  uint i_1;
  uint32 uVar12;
  ulong uVar13;
  uint64 uVar14;
  long lVar15;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar16;
  uint64 uVar17;
  uint uVar18;
  int iVar19;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar20;
  ulong uVar21;
  uint j;
  int iVar22;
  uint *puVar23;
  color_quad_u8 *pcVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  uchar *puVar28;
  int iVar29;
  int iVar30;
  undefined4 in_register_0000003c;
  long lVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  undefined7 in_register_00000089;
  uint uVar35;
  ulong uVar36;
  undefined8 uVar37;
  uint i_4;
  bool bVar38;
  float in_XMM0_Da;
  float fVar39;
  float fVar40;
  float in_XMM1_Da;
  double dVar41;
  double dVar42;
  float in_XMM3_Da;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  int max [3];
  uint ave_color [3];
  vec3F scaled_principle_axis;
  uint c;
  vec3F initial_ofs;
  color_quad_u8 endpoints [2];
  int min [3];
  vec3F probe_high_color;
  vec3F probe_low_color;
  color_quad_u8 expanded_endpoints [2];
  vec3F high_color;
  vec3F low_color;
  vec3F principle_axis;
  uint probe_low [17];
  double covf [6];
  byte local_228 [6];
  byte local_222;
  undefined1 local_221;
  undefined1 local_220;
  undefined1 local_21f;
  undefined1 local_21e;
  undefined1 local_21c;
  undefined1 local_21b;
  undefined1 local_21a;
  bool local_209;
  undefined8 local_208;
  undefined1 *local_200;
  uchar *local_1f8;
  uint *local_1f0;
  uint *local_1e8;
  uchar *local_1e0;
  undefined8 local_1d8;
  long lStack_1d0;
  long local_1c8;
  uint local_1bc;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *local_1b8;
  uint local_1b0 [3];
  float local_1a4 [3];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_198;
  int local_194;
  uint local_190;
  uint local_18c;
  uint local_180;
  float local_17c [3];
  uint64 local_170;
  uint *local_168;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_160;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_15c;
  dxt1_block local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  uint local_12c;
  float local_128 [6];
  ulong local_110;
  uint8 *local_108;
  ulong local_100;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_f4;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_f0;
  float local_ec [6];
  float local_d4 [3];
  double local_c8 [10];
  double local_78 [9];
  
  local_170 = CONCAT44(local_170._4_4_,(int)CONCAT71(in_register_00000089,refine));
  local_208 = CONCAT44(in_register_0000003c,n);
  uVar27 = (ulong)n;
  lVar31 = 0;
  pcVar24 = block;
  do {
    bVar1 = (block->field_0).c[lVar31];
    uVar13 = (ulong)bVar1;
    uVar34 = (uint)bVar1;
    uVar25 = (uint)bVar1;
    if (4 < n * 4) {
      uVar21 = 4;
      uVar26 = uVar13;
      uVar36 = uVar13;
      do {
        bVar1 = (pcVar24->field_0).c[uVar21];
        uVar13 = uVar13 + bVar1;
        if ((uint)bVar1 <= (uint)uVar26) {
          uVar26 = (ulong)bVar1;
        }
        uVar34 = (uint)uVar26;
        uVar25 = (uint)bVar1;
        if ((uint)bVar1 < (uint)uVar36) {
          uVar25 = (uint)uVar36;
        }
        uVar21 = uVar21 + 4;
        uVar36 = (ulong)uVar25;
      } while (uVar21 < n * 4);
    }
    local_1b0[lVar31] = (uint)((uVar13 + (n >> 1)) / uVar27);
    *(uint *)(local_158.m_low_color + lVar31 * 4) = uVar34;
    *(uint *)((long)&local_1d8 + lVar31 * 4) = uVar25;
    lVar31 = lVar31 + 1;
    pcVar24 = (color_quad_u8 *)((long)&pcVar24->field_0 + 1);
  } while (lVar31 != 3);
  local_1f0 = high16;
  local_1e8 = low16;
  if ((((uint)local_1d8 - local_158._0_4_ == 0) && (local_158.m_selectors == local_1d8._4_4_)) &&
     ((int)uStack_150 == (int)lStack_1d0)) {
    bVar10 = false;
  }
  else {
    local_c8[4] = 0.0;
    local_c8[5] = 0.0;
    local_c8[2] = 0.0;
    local_c8[3] = 0.0;
    local_c8[1] = 0.0;
    if (n == 0) {
      local_c8[0] = 0.0;
    }
    else {
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      local_c8[3] = 0.0;
      local_c8[4] = 0.0;
      local_c8[0] = 0.0;
      local_c8[5] = 0.0;
      uVar13 = 0;
      do {
        dVar46 = (double)(int)(block[uVar13].field_0.field_0.r - local_1b0[0]);
        dVar41 = (double)(int)(block[uVar13].field_0.field_0.g - local_1b0[1]);
        dVar42 = (double)(int)(block[uVar13].field_0.field_0.b - local_1b0[2]);
        local_c8[0] = local_c8[0] + dVar46 * dVar46;
        local_c8[1] = local_c8[1] + dVar46 * dVar41;
        local_c8[2] = local_c8[2] + dVar46 * dVar42;
        local_c8[3] = local_c8[3] + dVar41 * dVar41;
        local_c8[4] = local_c8[4] + dVar41 * dVar42;
        local_c8[5] = local_c8[5] + dVar42 * dVar42;
        uVar13 = uVar13 + 1;
      } while (uVar27 != uVar13);
    }
    lVar31 = 0;
    do {
      local_78[lVar31] = local_c8[lVar31] * 0.003921568859368563;
      lVar31 = lVar31 + 1;
    } while (lVar31 != 6);
    dVar42 = (double)((int)local_1d8._4_4_ - (int)local_158.m_selectors);
    dVar46 = (double)((int)lStack_1d0 - (int)uStack_150);
    iVar29 = 4;
    dVar41 = (double)(int)((uint)local_1d8 - local_158._0_4_);
    do {
      dVar43 = dVar46 * local_78[2] + dVar41 * local_78[0] + local_78[1] * dVar42;
      dVar44 = dVar42 * local_78[4];
      dVar42 = dVar46 * local_78[4] + dVar41 * local_78[1] + local_78[3] * dVar42;
      dVar46 = dVar46 * local_78[5] + dVar41 * local_78[2] + dVar44;
      iVar29 = iVar29 + -1;
      dVar41 = dVar43;
    } while (iVar29 != 0);
    dVar41 = ABS(dVar43);
    if (ABS(dVar43) <= ABS(dVar42)) {
      dVar41 = ABS(dVar42);
    }
    if (dVar41 <= ABS(dVar46)) {
      dVar41 = ABS(dVar46);
    }
    if (4.0 <= dVar41) {
      dVar41 = 512.0 / dVar41;
      iVar29 = (int)(dVar43 * dVar41);
      iVar32 = (int)(dVar42 * dVar41);
      iVar30 = (int)(dVar46 * dVar41);
      in_XMM3_Da = (float)(dVar43 * dVar41);
      in_XMM1_Da = (float)(dVar42 * dVar41);
      in_XMM0_Da = (float)(dVar46 * dVar41);
    }
    else {
      iVar30 = 0x3a;
      iVar32 = 300;
      iVar29 = 0x94;
      in_XMM3_Da = 148.0;
      in_XMM1_Da = 300.0;
      in_XMM0_Da = 58.0;
    }
    bVar1 = (block->field_0).field_0.r;
    bVar2 = (block->field_0).field_0.g;
    bVar3 = (block->field_0).field_0.b;
    local_200 = (undefined1 *)CONCAT71(local_200._1_7_,bVar3);
    local_1b8 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                CONCAT71(local_1b8._1_7_,bVar2);
    local_168 = (uint *)CONCAT71(local_168._1_7_,bVar1);
    if (n < 2) {
      local_1f8 = (uchar *)CONCAT71(local_1f8._1_7_,bVar2);
      local_1e0 = (uchar *)CONCAT71(local_1e0._1_7_,bVar1);
    }
    else {
      iVar19 = (uint)bVar3 * iVar30 + (uint)bVar1 * iVar29 + (uint)bVar2 * iVar32;
      lVar31 = 0;
      local_1e0 = (uchar *)CONCAT71(local_1e0._1_7_,bVar1);
      local_1f8 = (uchar *)CONCAT71(local_1f8._1_7_,bVar2);
      iVar33 = iVar19;
      do {
        bVar1 = block[lVar31 + 1].field_0.field_0.r;
        bVar2 = block[lVar31 + 1].field_0.field_0.g;
        bVar4 = block[lVar31 + 1].field_0.field_0.b;
        iVar22 = (uint)bVar4 * iVar30 + (uint)bVar2 * iVar32 + (uint)bVar1 * iVar29;
        if (iVar22 < iVar33) {
          local_1f8 = (uchar *)CONCAT71(local_1f8._1_7_,bVar2);
          local_1e0 = (uchar *)CONCAT71(local_1e0._1_7_,bVar1);
          iVar33 = iVar22;
          bVar3 = bVar4;
        }
        if (iVar19 < iVar22) {
          local_200 = (undefined1 *)CONCAT71(local_200._1_7_,bVar4);
          local_1b8 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                      CONCAT71(local_1b8._1_7_,bVar2);
          local_168 = (uint *)CONCAT71(local_168._1_7_,bVar1);
          iVar19 = iVar22;
        }
        lVar31 = lVar31 + 1;
      } while (uVar27 - 1 != lVar31);
    }
    *low16 = (((uint)(byte)local_200 * 0x1f + 0x80 >> 8) + (uint)(byte)local_200 * 0x1f + 0x80 >> 8)
             + (((uint)(byte)local_1b8 * 0x3f + 0x80 >> 8) + (uint)(byte)local_1b8 * 0x3f + 0x80 >>
                3 & 0x1fe0) +
             ((uint)(byte)local_168 * 0x1f + ((uint)(byte)local_168 * 0x1f + 0x80 >> 8) + 0x80 &
             0x7f00) * 8;
    *high16 = (((uint)bVar3 * 0x1f + 0x80 >> 8) + (uint)bVar3 * 0x1f + 0x80 >> 8) +
              (((uint)(byte)local_1f8 * 0x3f + 0x80 >> 8) + (uint)(byte)local_1f8 * 0x3f + 0x80 >> 3
              & 0x1fe0) +
              (((uint)(byte)local_1e0 * 0x1f + 0x80 >> 8) + (uint)(byte)local_1e0 * 0x1f + 0x80 &
              0x7f00) * 8;
    bVar10 = true;
    low16 = local_1e8;
    high16 = local_1f0;
  }
  if (bVar10) {
    local_200 = (undefined1 *)CONCAT44(local_200._4_4_,in_XMM3_Da);
    local_1f8 = (uchar *)CONCAT44(local_1f8._4_4_,in_XMM1_Da);
    bVar10 = determine_selectors(n,block,*low16,*high16,pSelectors);
    if (bVar10) {
      dVar41 = 0.0;
      dVar44 = 0.0;
      dVar47 = 0.0;
      dVar43 = 0.0;
      dVar45 = 0.0;
      dVar48 = 0.0;
      dVar42 = 0.0;
      dVar49 = 0.0;
      dVar46 = 0.0;
      if (n != 0) {
        uVar13 = 0;
        dVar46 = 0.0;
        do {
          dVar50 = (double)block[uVar13].field_0.field_0.r;
          dVar51 = (double)block[uVar13].field_0.field_0.g;
          dVar52 = (double)block[uVar13].field_0.field_0.b;
          bVar1 = pSelectors[uVar13];
          dVar46 = dVar46 + (double)dxt1_endpoint_optimizer::refine_solution::prods_0[bVar1];
          dVar49 = dVar49 + (double)dxt1_endpoint_optimizer::refine_solution::prods_1[bVar1];
          dVar42 = dVar42 + (double)dxt1_endpoint_optimizer::refine_solution::prods_2[bVar1];
          dVar53 = (double)dxt1_endpoint_optimizer::refine_solution::w1Tab[bVar1];
          dVar48 = dVar48 + dVar53 * dVar50;
          dVar45 = dVar45 + dVar53 * dVar51;
          dVar43 = dVar43 + dVar53 * dVar52;
          dVar47 = dVar47 + dVar50;
          dVar44 = dVar44 + dVar51;
          dVar41 = dVar41 + dVar52;
          uVar13 = uVar13 + 1;
        } while (uVar27 != uVar13);
      }
      if ((((dVar49 != 0.0) || (NAN(dVar49))) && ((dVar42 != 0.0 || (NAN(dVar42))))) &&
         (dVar50 = dVar42 * dVar49 - dVar46 * dVar46, 1.249999968422344e-05 <= ABS(dVar50))) {
        dVar44 = dVar44 * 3.0 - dVar45;
        dVar47 = dVar47 * 3.0 - dVar48;
        dVar50 = 0.364705890417099 / dVar50;
        iVar29 = (int)((dVar48 * dVar49 - dVar46 * dVar47) * dVar50 + 0.5);
        if (0x1e < iVar29) {
          iVar29 = 0x1f;
        }
        if (iVar29 < 1) {
          iVar29 = 0;
        }
        iVar32 = (int)((dVar45 * dVar49 - dVar46 * dVar44) * dVar50 * 2.0322580337524414 + 0.5);
        if (0x3e < iVar32) {
          iVar32 = 0x3f;
        }
        dVar41 = dVar41 * 3.0 - dVar43;
        if (iVar32 < 1) {
          iVar32 = 0;
        }
        uVar25 = (uint)((dVar49 * dVar43 - dVar46 * dVar41) * dVar50 + 0.5);
        if (0x1e < (int)uVar25) {
          uVar25 = 0x1f;
        }
        if ((int)uVar25 < 1) {
          uVar25 = 0;
        }
        iVar30 = (int)((dVar47 * dVar42 - dVar48 * dVar46) * dVar50 + 0.5);
        if (0x1e < iVar30) {
          iVar30 = 0x1f;
        }
        if (iVar30 < 1) {
          iVar30 = 0;
        }
        iVar33 = (int)((dVar44 * dVar42 - dVar45 * dVar46) * dVar50 * 2.0322580337524414 + 0.5);
        iVar19 = 0x3f;
        if (iVar33 < 0x3f) {
          iVar19 = iVar33;
        }
        uVar18 = *high16;
        if (iVar19 < 1) {
          iVar19 = 0;
        }
        uVar5 = *low16;
        uVar35 = (uint)((dVar41 * dVar42 - dVar46 * dVar43) * dVar50 + 0.5);
        uVar34 = 0x1f;
        if ((int)uVar35 < 0x1f) {
          uVar34 = uVar35;
        }
        *low16 = uVar25 | iVar29 << 0xb | iVar32 << 5;
        if ((int)uVar34 < 1) {
          uVar34 = 0;
        }
        uVar25 = uVar34 | iVar30 << 0xb | iVar19 << 5;
        *high16 = uVar25;
        if ((uVar18 != uVar25) || (uVar5 != *low16)) {
          determine_selectors(n,block,*low16,*high16,pSelectors);
          n = (uint)local_208;
        }
      }
      if ((char)local_170 != '\0') {
        uVar14 = determine_error(n,block,*low16,*high16,0xffffffffffffffff);
        n = (uint)local_208;
        if (uVar14 != 0) {
          fVar39 = in_XMM0_Da * in_XMM0_Da +
                   local_200._0_4_ * local_200._0_4_ + local_1f8._0_4_ * local_1f8._0_4_;
          if (fVar39 < 0.0) {
            fVar39 = sqrtf(fVar39);
          }
          else {
            fVar39 = SQRT(fVar39);
          }
          fVar39 = 1.0 / fVar39;
          local_d4[0] = local_200._0_4_ * fVar39;
          local_d4[1] = local_1f8._0_4_ * fVar39;
          local_d4[2] = in_XMM0_Da * fVar39;
          lVar31 = 0;
          do {
            local_1a4[lVar31] = local_ec[lVar31 + 6] * 0.027063293;
            lVar31 = lVar31 + 1;
          } while (lVar31 != 3);
          local_1a4[0] = local_1a4[0] * 31.0;
          local_1a4[1] = local_1a4[1] * 63.0;
          local_1a4[2] = local_1a4[2] * 31.0;
          lVar31 = 0;
          do {
            local_17c[lVar31] = local_1a4[lVar31] * -8.0;
            lVar31 = lVar31 + 1;
          } while (lVar31 != 3);
          local_17c[0] = local_17c[0] + 0.5;
          local_17c[1] = local_17c[1] + 0.5;
          local_17c[2] = local_17c[2] + 0.5;
          local_1bc = 0;
          local_170 = uVar14;
          local_108 = pSelectors;
          local_100 = uVar27;
          do {
            dxt1_block::unpack_color(&local_158,(uint16)*low16,false,0xff);
            uVar7 = local_158.m_low_color[0];
            uVar8 = local_158.m_low_color[1];
            uVar9 = local_158.m_high_color[0];
            dxt1_block::unpack_color(&local_158,(uint16)*local_1f0,false,0xff);
            local_ec[3] = (float)uVar7;
            local_ec[4] = (float)uVar8;
            local_ec[5] = (float)uVar9;
            local_ec[0] = (float)local_158.m_low_color[0];
            local_ec[1] = (float)local_158.m_low_color[1];
            local_ec[2] = (float)local_158.m_high_color[0];
            lVar31 = 0;
            do {
              local_128[lVar31 + 3] = local_ec[lVar31 + 3] + local_17c[lVar31];
              lVar31 = lVar31 + 1;
            } while (lVar31 != 3);
            lVar31 = 0;
            do {
              fVar39 = local_128[4];
              fVar40 = floorf(local_128[3]);
              iVar29 = (int)fVar40;
              if (0x1e < iVar29) {
                iVar29 = 0x1f;
              }
              if (iVar29 < 1) {
                iVar29 = 0;
              }
              fVar39 = floorf(fVar39);
              iVar32 = (int)fVar39;
              if (0x3e < iVar32) {
                iVar32 = 0x3f;
              }
              if (iVar32 < 1) {
                iVar32 = 0;
              }
              fVar39 = floorf(local_128[5]);
              uVar25 = (uint)fVar39;
              if (0x1e < (int)uVar25) {
                uVar25 = 0x1f;
              }
              if ((int)uVar25 < 1) {
                uVar25 = 0;
              }
              *(uint *)((long)local_c8 + lVar31 * 4) = iVar29 << 0xb | iVar32 << 5 | uVar25;
              lVar15 = 0;
              do {
                local_128[lVar15 + 3] = local_1a4[lVar15] + local_128[lVar15 + 3];
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              lVar31 = lVar31 + 1;
            } while (lVar31 != 0x11);
            lVar31 = 0;
            do {
              local_128[lVar31] = local_ec[lVar31] + local_17c[lVar31];
              lVar31 = lVar31 + 1;
            } while (lVar31 != 3);
            lVar31 = 0;
            do {
              fVar39 = local_128[1];
              fVar40 = floorf(local_128[0]);
              iVar29 = (int)fVar40;
              if (0x1e < iVar29) {
                iVar29 = 0x1f;
              }
              if (iVar29 < 1) {
                iVar29 = 0;
              }
              fVar39 = floorf(fVar39);
              iVar32 = (int)fVar39;
              if (0x3e < iVar32) {
                iVar32 = 0x3f;
              }
              if (iVar32 < 1) {
                iVar32 = 0;
              }
              fVar39 = floorf(local_128[2]);
              uVar25 = (uint)fVar39;
              if (0x1e < (int)uVar25) {
                uVar25 = 0x1f;
              }
              if ((int)uVar25 < 1) {
                uVar25 = 0;
              }
              *(uint *)((long)local_78 + lVar31 * 4) = iVar29 << 0xb | iVar32 << 5 | uVar25;
              lVar15 = 0;
              do {
                local_128[lVar15] = local_1a4[lVar15] + local_128[lVar15];
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              lVar31 = lVar31 + 1;
            } while (lVar31 != 0x11);
            uVar25 = *local_1e8;
            local_148 = 0;
            uStack_140 = 0;
            local_158.m_low_color[0] = '\0';
            local_158.m_low_color[1] = '\0';
            local_158.m_high_color[0] = '\0';
            local_158.m_high_color[1] = '\0';
            local_158.m_selectors[0] = '\0';
            local_158.m_selectors[1] = '\0';
            local_158.m_selectors[2] = '\0';
            local_158.m_selectors[3] = '\0';
            uStack_150 = 0;
            local_200 = (undefined1 *)CONCAT44(local_200._4_4_,*local_1f0);
            local_180 = *local_1f0 << 0x10 | uVar25;
            local_180 = fast_hash(&local_180,4);
            *(long *)(local_158.m_low_color + (local_180 >> 3 & 0x18)) =
                 1L << ((byte)local_180 & 0x3f);
            paVar16 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)0x0;
            do {
              local_1b8 = paVar16;
              local_1f8 = (uchar *)CONCAT44(local_1f8._4_4_,
                                            *(undefined4 *)((long)local_c8 + (long)paVar16 * 4));
              lVar31 = 0;
              do {
                uVar34 = *(uint *)((long)local_78 + lVar31 * 4);
                uVar18 = uVar34;
                if ((uint)local_1f8._0_4_ >= uVar34 && local_1f8._0_4_ != (float)uVar34) {
                  uVar18 = (uint)local_1f8._0_4_;
                }
                if ((uint)local_1f8._0_4_ < uVar34) {
                  uVar34 = (uint)local_1f8._0_4_;
                }
                local_1d8._0_4_ = uVar34 << 0x10 | uVar18;
                uVar12 = fast_hash(&local_1d8,4);
                uVar14 = local_170;
                local_1d8 = CONCAT44(local_1d8._4_4_,uVar12);
                uVar35 = uVar12 >> 6 & 3;
                if (((ulong)(&local_158)[uVar35] >> ((ulong)uVar12 & 0x3f) & 1) == 0) {
                  (&local_158)[uVar35] =
                       (dxt1_block)(1L << ((byte)uVar12 & 0x3f) | (ulong)(&local_158)[uVar35]);
                  local_1e0 = (uchar *)CONCAT44(local_1e0._4_4_,uVar18);
                  uVar17 = determine_error((uint)local_208,block,uVar18,uVar34,local_170);
                  bVar10 = uVar17 < uVar14;
                  if (bVar10) {
                    uVar25 = (uint)local_1e0;
                  }
                  uVar18 = (uint)local_200._0_4_;
                  if (bVar10) {
                    uVar18 = uVar34;
                  }
                  local_200 = (undefined1 *)CONCAT44(local_200._4_4_,uVar18);
                  if (bVar10) {
                    uVar14 = uVar17;
                  }
                  local_170 = uVar14;
                }
                puVar23 = local_1e8;
                high16 = local_1f0;
                lVar31 = lVar31 + 1;
              } while (lVar31 != 0x11);
              paVar16 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                        &(local_1b8->field_0).g;
            } while (paVar16 != (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)0x11
                    );
            local_209 = (float)*local_1f0 != local_200._0_4_ || *local_1e8 != uVar25;
            if ((float)*local_1f0 != local_200._0_4_ || *local_1e8 != uVar25) {
              *local_1e8 = uVar25;
              *local_1f0 = (uint)local_200._0_4_;
              determine_selectors((uint)local_208,block,*local_1e8,(uint)local_200._0_4_,pSelectors)
              ;
            }
            uVar25 = 0;
            local_110 = 0;
            uVar37 = local_208;
            do {
              puVar6 = local_1e8;
              local_12c = uVar25;
              uVar25 = *puVar23;
              uVar34 = *high16;
              local_228[0] = (&ryg_dxt::Expand5)[uVar25 >> 0xb & 0x1f];
              local_228[1] = (&ryg_dxt::Expand6)[uVar25 >> 5 & 0x3f];
              local_228[2] = (&ryg_dxt::Expand5)[uVar25 & 0x1f];
              local_228[4] = (&ryg_dxt::Expand5)[uVar34 >> 0xb & 0x1f];
              local_228[5] = (&ryg_dxt::Expand6)[uVar34 >> 5 & 0x3f];
              local_222 = (&ryg_dxt::Expand5)[uVar34 & 0x1f];
              local_228[3] = 0;
              local_221 = 0;
              local_220 = (char)(((uint)local_228[4] + (uint)local_228[0] * 2) / 3);
              local_21f = (char)(((uint)local_228[5] + (uint)local_228[1] * 2) / 3);
              local_21e = (char)(((uint)local_222 + (uint)local_228[2] * 2) / 3);
              local_21c = (char)(((uint)local_228[0] + (uint)local_228[4] * 2) / 3);
              local_21b = (char)(((uint)local_228[1] + (uint)local_228[5] * 2) / 3);
              local_21a = (char)(((uint)local_228[2] + (uint)local_222 * 2) / 3);
              local_1d8 = 0;
              lStack_1d0 = 0;
              local_1c8 = 0;
              if ((int)uVar37 == 0) {
                local_1d8 = 0;
              }
              else {
                lStack_1d0 = 0;
                local_1c8 = 0;
                uVar13 = 0;
                local_1d8 = 0;
                do {
                  uVar26 = (ulong)pSelectors[uVar13];
                  iVar29 = (uint)block[uVar13].field_0.field_0.r - (uint)local_228[uVar26 * 4];
                  local_1d8 = local_1d8 + (ulong)(uint)(iVar29 * iVar29);
                  iVar29 = (uint)block[uVar13].field_0.field_0.g - (uint)local_228[uVar26 * 4 + 1];
                  lStack_1d0 = lStack_1d0 + (ulong)(uint)(iVar29 * iVar29);
                  iVar29 = (uint)block[uVar13].field_0.field_0.b - (uint)local_228[uVar26 * 4 + 2];
                  local_1c8 = local_1c8 + (ulong)(uint)(iVar29 * iVar29);
                  uVar13 = uVar13 + 1;
                } while (uVar27 != uVar13);
              }
              dxt1_block::unpack_color((dxt1_block *)&local_198.field_0,(uint16)uVar25,false,0xff);
              local_160 = local_198;
              dxt1_block::unpack_color((dxt1_block *)&local_198.field_0,(uint16)*high16,false,0xff);
              local_15c = local_198;
              dxt1_block::unpack_color((dxt1_block *)&local_198.field_0,(uint16)*puVar6,true,0xff);
              local_f4 = local_198;
              dxt1_block::unpack_color((dxt1_block *)&local_198.field_0,(uint16)*high16,true,0xff);
              lVar31 = 0;
              local_f0 = local_198;
              bVar10 = false;
              pcVar24 = block;
              uVar37 = local_208;
              do {
                if ((&local_1d8)[lVar31] != 0) {
                  local_200 = &ryg_dxt::Expand5;
                  if (lVar31 == 1) {
                    local_200 = &ryg_dxt::Expand6;
                  }
                  local_1e0 = local_f4.c + lVar31;
                  puVar28 = local_160.c + lVar31;
                  local_1f8 = puVar28;
                  lVar15 = 0;
                  do {
                    uVar13 = lVar15 * 4 ^ 4;
                    *(uint *)((long)&local_198 + uVar13) = (uint)local_1e0[uVar13];
                    local_1b8 = &local_15c;
                    if (lVar15 == 0) {
                      local_1b8 = &local_160;
                    }
                    if (lVar15 == 0) {
                      high16 = local_1e8;
                    }
                    local_168 = high16;
                    iVar29 = -1;
                    do {
                      uVar25 = (uint)puVar28[lVar15 * 4] + iVar29;
                      if ((-1 < (int)uVar25) && ((int)uVar25 <= (int)(&DAT_001ac0dc)[lVar31])) {
                        aVar20.m_u32._1_3_ = 0;
                        aVar20.field_0.r = local_200[uVar25];
                        (&local_198)[lVar15] = aVar20;
                        local_190 = (local_194 + local_198.m_u32 * 2) / 3;
                        local_18c = (local_198.m_u32 + local_194 * 2) / 3;
                        if ((int)uVar37 == 0) {
                          uVar13 = 0;
                        }
                        else {
                          uVar26 = 1;
                          uVar13 = 0;
                          do {
                            iVar32 = (&local_198)[pSelectors[uVar26 - 1]].m_u32 -
                                     (uint)pcVar24[uVar26 - 1].field_0.field_0.r;
                            uVar13 = (uint)(iVar32 * iVar32) + uVar13;
                            if (uVar27 <= uVar26) break;
                            uVar26 = uVar26 + 1;
                          } while (uVar13 < (ulong)(&local_1d8)[lVar31]);
                        }
                        puVar28 = local_1f8;
                        if (uVar13 < (ulong)(&local_1d8)[lVar31]) {
                          local_1f8[lVar15 * 4] = (uchar)uVar25;
                          local_1e0[lVar15 * 4] = local_198.c[lVar15 * 4];
                          uVar11 = dxt1_block::pack_color
                                             ((color_quad_u8 *)&local_1b8->field_0,false,0x7f);
                          puVar6 = local_1e8;
                          puVar23 = local_1f0;
                          *local_168 = (uint)uVar11;
                          determine_selectors((uint)local_208,block,*local_1e8,*local_1f0,pSelectors
                                             );
                          uVar25 = *puVar6;
                          uVar34 = *puVar23;
                          local_228[0] = (&ryg_dxt::Expand5)[uVar25 >> 0xb & 0x1f];
                          local_228[1] = (&ryg_dxt::Expand6)[uVar25 >> 5 & 0x3f];
                          local_228[2] = (&ryg_dxt::Expand5)[uVar25 & 0x1f];
                          local_228[4] = (&ryg_dxt::Expand5)[uVar34 >> 0xb & 0x1f];
                          local_228[5] = (&ryg_dxt::Expand6)[uVar34 >> 5 & 0x3f];
                          local_222 = (&ryg_dxt::Expand5)[uVar34 & 0x1f];
                          local_220 = (char)(((uint)local_228[4] + (uint)local_228[0] * 2) / 3);
                          local_21f = (char)(((uint)local_228[5] + (uint)local_228[1] * 2) / 3);
                          local_21e = (char)(((uint)local_222 + (uint)local_228[2] * 2) / 3);
                          local_21c = (char)(((uint)local_228[0] + (uint)local_228[4] * 2) / 3);
                          local_21b = (char)(((uint)local_228[1] + (uint)local_228[5] * 2) / 3);
                          local_21a = (char)(((uint)local_228[2] + (uint)local_222 * 2) / 3);
                          local_1d8 = 0;
                          lStack_1d0 = 0;
                          local_1c8 = 0;
                          if ((int)local_208 == 0) {
                            local_1d8 = 0;
                          }
                          else {
                            lStack_1d0 = 0;
                            local_1c8 = 0;
                            uVar27 = 0;
                            local_1d8 = 0;
                            do {
                              uVar13 = (ulong)local_108[uVar27];
                              iVar32 = (uint)block[uVar27].field_0.field_0.r -
                                       (uint)local_228[uVar13 * 4];
                              local_1d8 = local_1d8 + (ulong)(uint)(iVar32 * iVar32);
                              iVar32 = (uint)block[uVar27].field_0.field_0.g -
                                       (uint)local_228[uVar13 * 4 + 1];
                              lStack_1d0 = lStack_1d0 + (ulong)(uint)(iVar32 * iVar32);
                              iVar32 = (uint)block[uVar27].field_0.field_0.b -
                                       (uint)local_228[uVar13 * 4 + 2];
                              local_1c8 = local_1c8 + (ulong)(uint)(iVar32 * iVar32);
                              uVar27 = uVar27 + 1;
                            } while (local_100 != uVar27);
                          }
                          bVar10 = true;
                          pSelectors = local_108;
                          puVar28 = local_1f8;
                          uVar37 = local_208;
                          uVar27 = local_100;
                        }
                      }
                      bVar38 = iVar29 < 0;
                      iVar29 = iVar29 + 2;
                    } while (bVar38);
                    bVar38 = lVar15 == 0;
                    lVar15 = lVar15 + 1;
                    high16 = local_1f0;
                  } while (bVar38);
                }
                low16 = local_1e8;
                n = (uint)uVar37;
                lVar31 = lVar31 + 1;
                pcVar24 = (color_quad_u8 *)((long)&pcVar24->field_0 + 1);
              } while (lVar31 != 3);
              uVar25 = local_12c & 0xff;
              if (!bVar10) break;
              uVar25 = 1;
              iVar29 = (int)local_110;
              local_110 = (ulong)(iVar29 + 1);
              puVar23 = local_1e8;
            } while (iVar29 == 0);
            if ((uVar25 & 1) == 0) {
              if ((local_209 & local_1bc < 3) != 1) break;
            }
            else {
              uVar14 = determine_error(n,block,*local_1e8,*high16,0xffffffffffffffff);
              n = (uint)local_208;
              if ((uVar14 == 0) || (2 < local_1bc)) break;
            }
            local_1bc = local_1bc + 1;
          } while( true );
        }
      }
    }
    else {
      memset(pSelectors,2,uVar27);
      *low16 = (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1b0[2] * 2] |
               (uint)(byte)ryg_dxt::OMatch6[(ulong)local_1b0[1] * 2] << 5 |
               (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1b0[0] * 2] << 0xb;
      *local_1f0 = (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1b0[2] * 2 + 1] |
                   (uint)(byte)ryg_dxt::OMatch6[(ulong)local_1b0[1] * 2 + 1] << 5 |
                   (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1b0[0] * 2 + 1] << 0xb;
      high16 = local_1f0;
    }
  }
  else {
    memset(pSelectors,2,uVar27);
    n = (uint)local_208;
    *low16 = (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1b0[2] * 2] |
             (uint)(byte)ryg_dxt::OMatch6[(ulong)local_1b0[1] * 2] << 5 |
             (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1b0[0] * 2] << 0xb;
    *local_1f0 = (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1b0[2] * 2 + 1] |
                 (uint)(byte)ryg_dxt::OMatch6[(ulong)local_1b0[1] * 2 + 1] << 5 |
                 (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1b0[0] * 2 + 1] << 0xb;
    high16 = local_1f0;
  }
  uVar25 = *low16;
  if (uVar25 < *high16) {
    *low16 = *high16;
    *high16 = uVar25;
    if (n != 0) {
      uVar13 = 0;
      do {
        pSelectors[uVar13] = pSelectors[uVar13] ^ 1;
        uVar13 = uVar13 + 1;
      } while (uVar27 != uVar13);
    }
  }
  return;
}

Assistant:

void compress_color_block(uint n, const color_quad_u8* block, uint& low16, uint& high16, uint8* pSelectors, bool refine)
        {
            CRNLIB_ASSERT((n & 15) == 0);

            uint ave_color[3];
            float axis[3];

            if (!optimize_block_colors(n, block, low16, high16, ave_color, axis))
            {
                compress_solid_block(n, ave_color, low16, high16, pSelectors);
            }
            else
            {
                if (!determine_selectors(n, block, low16, high16, pSelectors))
                {
                    compress_solid_block(n, ave_color, low16, high16, pSelectors);
                }
                else
                {
                    if (refine_block(n, block, low16, high16, pSelectors))
                    {
                        determine_selectors(n, block, low16, high16, pSelectors);
                    }

                    if (refine)
                    {
                        refine_endpoints2(n, block, low16, high16, pSelectors, axis);
                    }
                }
            }

            if (low16 < high16)
            {
                std::swap(low16, high16);
                for (uint i = 0; i < n; i++)
                {
                    pSelectors[i] ^= 1;
                }
            }
        }